

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlSchemaValPtr xmlSchemaCopyValue(xmlSchemaValPtr val)

{
  xmlChar *pxVar1;
  xmlSchemaValPtr local_30;
  xmlSchemaValPtr cur;
  xmlSchemaValPtr prev;
  xmlSchemaValPtr ret;
  xmlSchemaValPtr val_local;
  
  prev = (xmlSchemaValPtr)0x0;
  cur = (xmlSchemaValPtr)0x0;
  for (ret = val; ret != (xmlSchemaValPtr)0x0; ret = ret->next) {
    switch(ret->type) {
    case XML_SCHEMAS_STRING:
    case XML_SCHEMAS_NORMSTRING:
    case XML_SCHEMAS_TOKEN:
    case XML_SCHEMAS_LANGUAGE:
    case XML_SCHEMAS_NMTOKEN:
    case XML_SCHEMAS_NAME:
    case XML_SCHEMAS_NCNAME:
    case XML_SCHEMAS_ID:
    case XML_SCHEMAS_IDREF:
    case XML_SCHEMAS_ENTITY:
    case XML_SCHEMAS_ANYURI:
    case XML_SCHEMAS_ANYSIMPLETYPE:
      local_30 = xmlSchemaDupVal(ret);
      if ((ret->value).decimal.lo != 0) {
        pxVar1 = xmlStrdup((ret->value).qname.name);
        (local_30->value).qname.name = pxVar1;
      }
      break;
    default:
      local_30 = xmlSchemaDupVal(ret);
      break;
    case XML_SCHEMAS_NMTOKENS:
    case XML_SCHEMAS_IDREFS:
    case XML_SCHEMAS_ENTITIES:
    case XML_SCHEMAS_ANYTYPE:
      xmlSchemaFreeValue(prev);
      return (xmlSchemaValPtr)0x0;
    case XML_SCHEMAS_QNAME:
    case XML_SCHEMAS_NOTATION:
      local_30 = xmlSchemaDupVal(ret);
      if ((ret->value).decimal.lo != 0) {
        pxVar1 = xmlStrdup((ret->value).qname.name);
        (local_30->value).qname.name = pxVar1;
      }
      if ((ret->value).decimal.mi != 0) {
        pxVar1 = xmlStrdup((ret->value).qname.uri);
        (local_30->value).qname.uri = pxVar1;
      }
      break;
    case XML_SCHEMAS_HEXBINARY:
      local_30 = xmlSchemaDupVal(ret);
      if ((ret->value).decimal.lo != 0) {
        pxVar1 = xmlStrdup((ret->value).qname.name);
        (local_30->value).qname.name = pxVar1;
      }
      break;
    case XML_SCHEMAS_BASE64BINARY:
      local_30 = xmlSchemaDupVal(ret);
      if ((ret->value).decimal.lo != 0) {
        pxVar1 = xmlStrdup((ret->value).qname.name);
        (local_30->value).qname.name = pxVar1;
      }
    }
    if (prev == (xmlSchemaValPtr)0x0) {
      prev = local_30;
    }
    else {
      cur->next = local_30;
    }
    cur = local_30;
  }
  return prev;
}

Assistant:

xmlSchemaValPtr
xmlSchemaCopyValue(xmlSchemaValPtr val)
{
    xmlSchemaValPtr ret = NULL, prev = NULL, cur;

    /*
    * Copy the string values.
    */
    while (val != NULL) {
	switch (val->type) {
	    case XML_SCHEMAS_ANYTYPE:
	    case XML_SCHEMAS_IDREFS:
	    case XML_SCHEMAS_ENTITIES:
	    case XML_SCHEMAS_NMTOKENS:
		xmlSchemaFreeValue(ret);
		return (NULL);
	    case XML_SCHEMAS_ANYSIMPLETYPE:
	    case XML_SCHEMAS_STRING:
	    case XML_SCHEMAS_NORMSTRING:
	    case XML_SCHEMAS_TOKEN:
	    case XML_SCHEMAS_LANGUAGE:
	    case XML_SCHEMAS_NAME:
	    case XML_SCHEMAS_NCNAME:
	    case XML_SCHEMAS_ID:
	    case XML_SCHEMAS_IDREF:
	    case XML_SCHEMAS_ENTITY:
	    case XML_SCHEMAS_NMTOKEN:
	    case XML_SCHEMAS_ANYURI:
		cur = xmlSchemaDupVal(val);
		if (val->value.str != NULL)
		    cur->value.str = xmlStrdup(BAD_CAST val->value.str);
		break;
	    case XML_SCHEMAS_QNAME:
	    case XML_SCHEMAS_NOTATION:
		cur = xmlSchemaDupVal(val);
		if (val->value.qname.name != NULL)
		    cur->value.qname.name =
                    xmlStrdup(BAD_CAST val->value.qname.name);
		if (val->value.qname.uri != NULL)
		    cur->value.qname.uri =
                    xmlStrdup(BAD_CAST val->value.qname.uri);
		break;
	    case XML_SCHEMAS_HEXBINARY:
		cur = xmlSchemaDupVal(val);
		if (val->value.hex.str != NULL)
		    cur->value.hex.str = xmlStrdup(BAD_CAST val->value.hex.str);
		break;
	    case XML_SCHEMAS_BASE64BINARY:
		cur = xmlSchemaDupVal(val);
		if (val->value.base64.str != NULL)
		    cur->value.base64.str =
                    xmlStrdup(BAD_CAST val->value.base64.str);
		break;
	    default:
		cur = xmlSchemaDupVal(val);
		break;
	}
	if (ret == NULL)
	    ret = cur;
	else
	    prev->next = cur;
	prev = cur;
	val = val->next;
    }
    return (ret);
}